

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O0

void __thiscall
ImporterCoverage_importingComponentWithCnUnitsThatReferenceEmptyNamedUnits_Test::
~ImporterCoverage_importingComponentWithCnUnitsThatReferenceEmptyNamedUnits_Test
          (ImporterCoverage_importingComponentWithCnUnitsThatReferenceEmptyNamedUnits_Test *this)

{
  ImporterCoverage_importingComponentWithCnUnitsThatReferenceEmptyNamedUnits_Test *this_local;
  
  ~ImporterCoverage_importingComponentWithCnUnitsThatReferenceEmptyNamedUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ImporterCoverage, importingComponentWithCnUnitsThatReferenceEmptyNamedUnits)
{
    const std::vector<std::string> expectedIssuesModel = {
        "Imported component 'c' is not valid because:\n"
        "  -> Component 'c' importing 'myComponent' from 'not_required_resolving_import_manually' has an error:\n"
        "   - Variable 'a' in component 'myComponent' does not have a valid units attribute. The attribute given is ''. CellML identifiers must contain one or more basic Latin alphabetic characters.",
        "Imported component 'c' is not valid because:\n"
        "  -> Component 'c' importing 'myComponent' from 'not_required_resolving_import_manually' has an error:\n"
        "   - Math cn element with the value '1' does not have a valid cellml:units attribute. CellML identifiers must contain one or more basic Latin alphabetic characters.",
        "Imported component 'c' is not valid because:\n"
        "  -> Component 'c' importing 'myComponent' from 'not_required_resolving_import_manually' has an error:\n"
        "   - W3C MathML DTD error: No declaration for attribute unuts of element cn.",
    };

    const std::vector<std::string> expectedIssuesFLatModel = {
        "Math cn element with the value '1' does not have a valid cellml:units attribute. CellML identifiers must contain one or more basic Latin alphabetic characters.",
        "W3C MathML DTD error: No declaration for attribute unuts of element cn.",
    };

    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"myModel\">\n"
        "  <units name=\"\">\n"
        "    <unit units=\"metre\" prefix=\"milli\"/>\n"
        "  </units>\n"
        "   <component name=\"myComponent\">\n"
        "       <variable name=\"a\" units=\"\"/>\n"
        "       <math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n"
        "           <apply>"
        "             <eq/>\n"
        "             <ci>a</ci>\n"
        "             <cn cellml:unuts=\"\">1</cn>\n"
        "           </apply>\n"
        "       </math>\n"
        "   </component>\n"
        "</model>";

    // Create the model by parsing the string above.
    auto parser = libcellml::Parser::create();
    auto importedModel = parser->parseModel(in);
    auto importer = libcellml::Importer::create();
    auto validator = libcellml::Validator::create();

    auto model = libcellml::Model::create("myModel");
    auto u = libcellml::Units::create("mm");
    u->addUnit("metre", "milli");
    model->addUnits(u);

    auto c = libcellml::Component::create("c");

    auto importSource = libcellml::ImportSource::create();
    importSource->setUrl("not_required_resolving_import_manually");
    importSource->setModel(importedModel);

    c->setImportReference("myComponent");
    c->setImportSource(importSource);
    model->addComponent(c);

    EXPECT_FALSE(model->hasUnresolvedImports());

    validator->validateModel(model);
    EXPECT_EQ(size_t(3), validator->errorCount());
    expectEqualIssues(expectedIssuesModel, validator);

    model = importer->flattenModel(model);

    validator->validateModel(model);
    EXPECT_EQ(size_t(2), validator->errorCount());
    expectEqualIssues(expectedIssuesFLatModel, validator);
}